

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  BYTE *pBVar1;
  byte bVar2;
  BYTE BVar3;
  ushort uVar4;
  undefined8 uVar5;
  ushort uVar6;
  U32 length;
  uint uVar7;
  ulong uVar8;
  BYTE *pBVar9;
  uint uVar10;
  BYTE *s;
  ulong uVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  size_t __n;
  ushort *puVar17;
  ushort *puVar18;
  BYTE *d;
  BYTE *pBVar19;
  int local_40;
  
  if (source == (char *)0x0) {
    uVar10 = 0xffffffff;
  }
  else {
    if (originalSize != 0) {
      pBVar1 = (BYTE *)(dest + originalSize);
      pBVar13 = (BYTE *)(dest + (long)originalSize + -8);
      pBVar12 = (BYTE *)(dest + (long)originalSize + -0x1a);
      local_40 = (int)source;
      if (0x3f < originalSize) {
        do {
          while( true ) {
            bVar2 = (byte)*(ushort *)source;
            uVar10 = (uint)(bVar2 >> 4);
            if (uVar10 == 0xf) {
              uVar10 = 0;
              puVar18 = (ushort *)((long)source + 0x10);
              do {
                puVar17 = puVar18;
                uVar10 = uVar10 + *(byte *)((long)puVar17 + -0xf);
                puVar18 = (ushort *)((long)puVar17 + 1);
              } while (*(byte *)((long)puVar17 + -0xf) == 0xff);
              uVar8 = (ulong)uVar10;
              pBVar19 = (BYTE *)dest + uVar8 + 0xf;
              if (pBVar13 < pBVar19) {
                __n = uVar8 + 0xf;
                source = (char *)(puVar17 + -7);
                goto LAB_001128e4;
              }
              puVar18 = puVar17 + -7;
              do {
                *(undefined8 *)dest = *(undefined8 *)puVar18;
                dest = (char *)((BYTE *)dest + 8);
                puVar18 = puVar18 + 4;
              } while (dest < pBVar19);
              puVar18 = (ushort *)((long)puVar17 + 1 + uVar8);
            }
            else {
              *(undefined8 *)dest = *(undefined8 *)((long)source + 1);
              if (0x8f < bVar2) {
                *(undefined8 *)((BYTE *)dest + 8) = *(undefined8 *)((long)source + 9);
              }
              pBVar19 = (BYTE *)dest + uVar10;
              puVar18 = (ushort *)((byte *)((long)source + 1) + uVar10);
            }
            uVar4 = *puVar18;
            uVar11 = (ulong)uVar4;
            uVar10 = (uint)uVar4;
            source = (char *)(puVar18 + 1);
            pBVar14 = pBVar19 + -uVar11;
            uVar8 = (ulong)(bVar2 & 0xf);
            if (uVar8 != 0xf) break;
            uVar7 = 0;
            do {
              uVar6 = *(ushort *)source;
              source = (char *)((long)source + 1);
              uVar7 = uVar7 + (byte)uVar6;
            } while ((byte)uVar6 == 0xff);
            dest = (char *)(pBVar19 + (ulong)uVar7 + 0x13);
            if (pBVar1 + -0x40 <= dest) {
              uVar8 = (ulong)uVar7 + 0x13;
              goto LAB_0011293a;
            }
            if (uVar4 < 0x10) {
LAB_00112813:
              LZ4_memcpy_using_offset(pBVar19,pBVar14,(BYTE *)dest,uVar11);
            }
            else {
              do {
                uVar5 = *(undefined8 *)(pBVar19 + -uVar11 + 8);
                *(undefined8 *)pBVar19 = *(undefined8 *)(pBVar19 + -uVar11);
                *(undefined8 *)(pBVar19 + 8) = uVar5;
                uVar5 = *(undefined8 *)(pBVar19 + -uVar11 + 0x10 + 8);
                *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)(pBVar19 + -uVar11 + 0x10);
                *(undefined8 *)(pBVar19 + 0x18) = uVar5;
                pBVar19 = pBVar19 + 0x20;
              } while (pBVar19 < dest);
            }
          }
          dest = (char *)(pBVar19 + uVar8 + 4);
          uVar10 = (uint)uVar4;
          if (pBVar1 + -0x40 <= dest) goto LAB_00112936;
          if (uVar4 < 8) goto LAB_00112813;
          *(undefined8 *)pBVar19 = *(undefined8 *)pBVar14;
          *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)(pBVar14 + 8);
          *(undefined2 *)(pBVar19 + 0x10) = *(undefined2 *)(pBVar14 + 0x10);
        } while( true );
      }
      while( true ) {
        while( true ) {
          bVar2 = (byte)*(ushort *)source;
          source = (char *)((long)source + 1);
          __n = (size_t)(uint)(bVar2 >> 4);
          if ((0x8f < bVar2) || (pBVar12 < dest)) break;
          *(undefined8 *)dest = *(undefined8 *)source;
          pBVar19 = (BYTE *)dest + __n;
          uVar8 = (ulong)(bVar2 & 0xf);
          puVar18 = (ushort *)((long)source + __n);
          source = (char *)(puVar18 + 1);
          uVar4 = *puVar18;
          pBVar14 = pBVar19 + -(ulong)uVar4;
          if ((uVar8 == 0xf) || (uVar4 < 8)) goto LAB_00112918;
          *(undefined8 *)pBVar19 = *(undefined8 *)pBVar14;
          *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)(pBVar14 + 8);
          *(undefined2 *)(pBVar19 + 0x10) = *(undefined2 *)(pBVar14 + 0x10);
          dest = (char *)(pBVar19 + uVar8 + 4);
        }
        if (bVar2 >> 4 == 0xf) {
          uVar10 = 0;
          do {
            uVar4 = *(ushort *)source;
            source = (char *)((long)source + 1);
            uVar10 = uVar10 + (byte)uVar4;
          } while ((byte)uVar4 == 0xff);
          __n = (ulong)uVar10 + 0xf;
        }
        pBVar19 = (BYTE *)dest + __n;
LAB_001128e4:
        puVar18 = (ushort *)source;
        if (pBVar13 < pBVar19) break;
        do {
          *(undefined8 *)dest = *(undefined8 *)puVar18;
          dest = (char *)((BYTE *)dest + 8);
          puVar18 = puVar18 + 4;
        } while (dest < pBVar19);
        puVar18 = (ushort *)((long)source + __n);
        source = (char *)(puVar18 + 1);
        uVar4 = *puVar18;
        pBVar14 = pBVar19 + -(ulong)uVar4;
        uVar8 = (ulong)(bVar2 & 0xf);
LAB_00112918:
        uVar10 = (uint)uVar4;
        if ((int)uVar8 == 0xf) {
          uVar7 = 0;
          do {
            uVar6 = *(ushort *)source;
            source = (char *)((long)source + 1);
            uVar7 = uVar7 + (byte)uVar6;
          } while ((byte)uVar6 == 0xff);
          uVar8 = (ulong)uVar7 + 0xf;
        }
LAB_00112936:
        uVar8 = uVar8 + 4;
LAB_0011293a:
        dest = (char *)(pBVar19 + uVar8);
        if (uVar10 < 8) {
          pBVar19[0] = '\0';
          pBVar19[1] = '\0';
          pBVar19[2] = '\0';
          pBVar19[3] = '\0';
          *pBVar19 = *pBVar14;
          pBVar19[1] = pBVar14[1];
          pBVar19[2] = pBVar14[2];
          pBVar19[3] = pBVar14[3];
          uVar11 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar10 << 2));
          *(undefined4 *)(pBVar19 + 4) = *(undefined4 *)(pBVar14 + uVar11);
          pBVar14 = pBVar14 + (uVar11 - (long)*(int *)((long)dec64table + (ulong)(uVar10 << 2)));
        }
        else {
          *(undefined8 *)pBVar19 = *(undefined8 *)pBVar14;
          pBVar14 = pBVar14 + 8;
        }
        pBVar9 = pBVar19 + 8;
        if (pBVar1 + -0xc < dest) {
          if (pBVar1 + -5 < dest) goto LAB_0011299a;
          pBVar19 = pBVar1 + -7;
          pBVar15 = pBVar14;
          pBVar16 = pBVar9;
          if (pBVar9 < pBVar19) {
            do {
              *(undefined8 *)pBVar16 = *(undefined8 *)pBVar15;
              pBVar16 = pBVar16 + 8;
              pBVar15 = pBVar15 + 8;
            } while (pBVar16 < pBVar19);
            pBVar14 = pBVar14 + ((long)pBVar19 - (long)pBVar9);
            pBVar9 = pBVar19;
          }
          for (; pBVar9 < dest; pBVar9 = pBVar9 + 1) {
            BVar3 = *pBVar14;
            pBVar14 = pBVar14 + 1;
            *pBVar9 = BVar3;
          }
        }
        else {
          *(undefined8 *)pBVar9 = *(undefined8 *)pBVar14;
          if (0x10 < uVar8) {
            pBVar19 = pBVar19 + 0x10;
            do {
              pBVar14 = pBVar14 + 8;
              *(undefined8 *)pBVar19 = *(undefined8 *)pBVar14;
              pBVar19 = pBVar19 + 8;
            } while (pBVar19 < dest);
          }
        }
      }
      if (pBVar19 == pBVar1) {
        memmove(dest,source,__n);
        return ((int)source + (int)__n) - local_40;
      }
LAB_0011299a:
      return ~(uint)source + local_40;
    }
    uVar10 = -(uint)(*source != '\0') | 1;
  }
  return uVar10;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}